

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::objUnscaled(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,int i)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int local_50;
  undefined4 uStack_4c;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  int local_28;
  undefined1 local_24;
  undefined8 local_20;
  
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  if (this->_isScaled == true) {
    (*this->lp_scaler->_vptr_SPxScaler[0x18])(&local_50,this->lp_scaler,this);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) = local_30;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) = local_40;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uStack_38;
    *(ulong *)(__return_storage_ptr__->m_backend).data._M_elems = CONCAT44(uStack_4c,local_50);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uStack_48;
    uVar2 = (undefined4)local_20;
    uVar3 = (undefined4)((ulong)local_20 >> 0x20);
  }
  else {
    pnVar4 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         *(undefined8 *)(pnVar4[i].m_backend.data._M_elems + 8);
    uVar5 = *(undefined8 *)&pnVar4[i].m_backend.data;
    uVar6 = *(undefined8 *)(pnVar4[i].m_backend.data._M_elems + 2);
    puVar1 = pnVar4[i].m_backend.data._M_elems + 4;
    uVar7 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar7;
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar5;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar6;
    local_28 = pnVar4[i].m_backend.exp;
    local_24 = pnVar4[i].m_backend.neg;
    uVar2 = pnVar4[i].m_backend.fpclass;
    uVar3 = pnVar4[i].m_backend.prec_elem;
  }
  (__return_storage_ptr__->m_backend).exp = local_28;
  (__return_storage_ptr__->m_backend).neg = (bool)local_24;
  (__return_storage_ptr__->m_backend).fpclass = uVar2;
  (__return_storage_ptr__->m_backend).prec_elem = uVar3;
  if (this->thesense == MINIMIZE) {
    local_50 = -1;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
    ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  *)__return_storage_ptr__,&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxLPBase<R>::objUnscaled(int i) const
{
   assert(i >= 0 && i < nCols());
   R res;

   if(_isScaled)
   {
      res = lp_scaler->maxObjUnscaled(*this, i);
   }
   else
   {
      res = maxObj(i);
   }

   if(spxSense() == MINIMIZE)
      res *= -1;

   return res;
}